

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O1

ProStringList * __thiscall
ProjectBuilderMakefileGenerator::fixListForOutput
          (ProStringList *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,char *where)

{
  QMakeProject *this_00;
  ProStringList *l;
  long in_FS_OFFSET;
  ProKey local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,where);
  l = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&local_58);
  fixListForOutput(__return_storage_ptr__,this,l);
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
ProjectBuilderMakefileGenerator::fixListForOutput(const char *where)
{
    return fixListForOutput(project->values(where));
}